

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O0

string * AutoArgParse::UnexpectedArgException::makeErrorMessage
                   (string *__return_storage_ptr__,string *unexpectedArg,FlagStore *flagStore)

{
  ostream *poVar1;
  ostringstream local_198 [8];
  ostringstream os;
  FlagStore *flagStore_local;
  string *unexpectedArg_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Unexpected argument: ");
  poVar1 = std::operator<<(poVar1,(string *)unexpectedArg);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)local_198,"Valid option(s): ");
  printUnParsed((ostringstream *)local_198,&flagStore->flagInsertionOrder,&flagStore->flags);
  printUnParsed((ostringstream *)local_198,&flagStore->args);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

static std::string makeErrorMessage(const std::string& unexpectedArg,
                                        const FlagStore& flagStore) {
        std::ostringstream os;
        os << "Unexpected argument: " << unexpectedArg << std::endl;
        os << "Valid option(s): ";
        printUnParsed(os, flagStore.flagInsertionOrder, flagStore.flags);
        printUnParsed(os, flagStore.args);
        return os.str();
    }